

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.cpp
# Opt level: O1

BumpAllocator * __thiscall slang::BumpAllocator::operator=(BumpAllocator *this,BumpAllocator *other)

{
  Segment *pSVar1;
  Segment *pSVar2;
  
  if (this != other) {
    pSVar2 = this->head;
    while (pSVar2 != (Segment *)0x0) {
      pSVar1 = pSVar2->prev;
      free(pSVar2);
      pSVar2 = pSVar1;
    }
    pSVar2 = other->head;
    other->head = (Segment *)0x0;
    this->head = pSVar2;
    this->endPtr = other->endPtr;
  }
  return this;
}

Assistant:

BumpAllocator& BumpAllocator::operator=(BumpAllocator&& other) noexcept {
    if (this != &other) {
        this->~BumpAllocator();
        new (this) BumpAllocator(std::move(other));
    }
    return *this;
}